

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetPchSource
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  char *pcVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  _Base_ptr p_Var3;
  _Alloc_hider _Var4;
  _Base_ptr destination;
  bool bVar5;
  int iVar6;
  long *plVar7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var8;
  cmValue name;
  cmGeneratorTarget *pcVar9;
  string *psVar10;
  mapped_type *pmVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  size_type sVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar16;
  string filename_tmp;
  string pchHeader;
  cmGeneratedFileStream file;
  undefined1 local_350 [48];
  string *local_320;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  _Base_ptr local_2d8;
  size_type local_2d0;
  string *local_2c8;
  string local_2c0;
  string *local_2a0;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  pointer local_270;
  undefined1 local_268 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8 [6];
  
  iVar6 = std::__cxx11::string::compare((char *)language);
  if ((((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)language), iVar6 != 0)) &&
      (iVar6 = std::__cxx11::string::compare((char *)language), iVar6 != 0)) &&
     (iVar6 = std::__cxx11::string::compare((char *)language), iVar6 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_320 = __return_storage_ptr__;
  std::operator+(&local_2f8,language,config);
  local_2c8 = arch;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2f8,(ulong)(arch->_M_dataplus)._M_p);
  paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_350 + 0x10);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_350._16_8_ = paVar12->_M_allocated_capacity;
    local_350._24_8_ = plVar7[3];
    local_350._0_8_ = paVar15;
  }
  else {
    local_350._16_8_ = paVar12->_M_allocated_capacity;
    local_350._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_298._8_8_ = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ == paVar15) {
    local_288._8_8_ = local_350._24_8_;
    local_298._0_8_ = &local_288;
  }
  else {
    local_298._0_8_ = local_350._0_8_;
  }
  local_288._M_allocated_capacity = local_350._16_8_;
  local_350._8_8_ = 0;
  local_350._16_8_ = local_350._16_8_ & 0xffffffffffffff00;
  local_278._M_p = "";
  local_350._0_8_ = paVar15;
  pVar16 = std::
           _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::_M_emplace_unique<std::pair<std::__cxx11::string,char_const*>>
                     ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                       *)&this->PchSources,
                      (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
                       *)local_298);
  _Var8 = pVar16.first._M_node;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ != paVar15) {
    operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  psVar10 = local_320;
  if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    GetPchHeader(&local_2f8,this,config,language,local_2c8);
    if (local_2f8._M_string_length == 0) {
      (local_320->_M_dataplus)._M_p = (pointer)&local_320->field_2;
      local_320->_M_string_length = 0;
      (local_320->field_2)._M_local_buf[0] = '\0';
      psVar10 = local_320;
    }
    else {
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_298,"PRECOMPILE_HEADERS_REUSE_FROM","");
      name = GetProperty(this,(string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      pcVar9 = this;
      if (name.Value != (string *)0x0) {
        pcVar9 = cmGlobalGenerator::FindGeneratorTarget
                           (this->LocalGenerator->GlobalGenerator,name.Value);
      }
      local_2d0 = local_2f8._M_string_length;
      local_2a0 = name.Value;
      psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar9->LocalGenerator);
      pcVar1 = (psVar10->_M_dataplus)._M_p;
      pcVar2 = (pointer)psVar10->_M_string_length;
      psVar10 = cmTarget::GetName_abi_cxx11_(pcVar9->Target);
      local_288._M_allocated_capacity = 0xc;
      local_288._8_8_ = (long)"**/CMakeFiles/" + 2;
      local_270 = (psVar10->_M_dataplus)._M_p;
      local_278._M_p = (pointer)psVar10->_M_string_length;
      local_268._0_8_ = 0xe;
      local_268._8_8_ = ".dir/cmake_pch";
      views._M_len = 4;
      views._M_array = (iterator)local_298;
      local_298._0_8_ = pcVar2;
      local_298._8_8_ = pcVar1;
      cmCatViews_abi_cxx11_((string *)local_350,views);
      local_2d8 = _Var8._M_node + 2;
      std::__cxx11::string::operator=((string *)local_2d8,(string *)local_350);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
      this_00 = this->Makefile;
      local_298._0_8_ = &local_288;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_LINK_PCH","");
      psVar10 = local_2c8;
      bVar5 = cmMakefile::IsOn(this_00,(string *)local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_298,(char (*) [2])0x769305,(char (*) [3])0x7d82c6);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[5],_true>
                  (&local_258,(char (*) [4])0x75744c,(char (*) [5])0x79164d);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
                  (&local_218,(char (*) [5])"OBJC",(char (*) [3])0x7408ae);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[4],_true>
                  (local_1d8,(char (*) [7])"OBJCXX",(char (*) [4])0x78dacf);
        __l._M_len = 4;
        __l._M_array = (iterator)local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350,__l,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2c0,(allocator_type *)&local_318);
        sVar14 = local_2d0;
        lVar13 = -0x100;
        paVar15 = &local_1d8[0].second.field_2;
        do {
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar15->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar15->_M_allocated_capacity)[-2],
                            paVar15->_M_allocated_capacity + 1);
          }
          if (&paVar15->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar15->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar15->_M_allocated_capacity)[-6],
                            (&paVar15->_M_allocated_capacity)[-4] + 1);
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + -8);
          lVar13 = lVar13 + 0x40;
        } while (lVar13 != 0);
        pcVar1 = *(char **)(_Var8._M_node + 2);
        p_Var3 = _Var8._M_node[2]._M_parent;
        if (psVar10->_M_string_length == 0) {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
        }
        else {
          local_288._8_8_ = (psVar10->_M_dataplus)._M_p;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_298._8_8_ = "_";
          views_00._M_len = 2;
          views_00._M_array = (iterator)local_298;
          local_288._M_allocated_capacity = psVar10->_M_string_length;
          cmCatViews_abi_cxx11_(&local_318,views_00);
        }
        _Var4._M_p = local_318._M_dataplus._M_p;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_350,language);
        local_288._M_allocated_capacity = local_318._M_string_length;
        local_288._8_8_ = _Var4._M_p;
        local_270 = (pmVar11->_M_dataplus)._M_p;
        local_278._M_p = (pointer)pmVar11->_M_string_length;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_298;
        local_298._0_8_ = p_Var3;
        local_298._8_8_ = pcVar1;
        cmCatViews_abi_cxx11_(&local_2c0,views_02);
      }
      else {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[2],_const_char_(&)[5],_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_298,(char (*) [2])0x769305,(char (*) [5])".h.c");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[4],_const_char_(&)[9],_true>
                  (&local_258,(char (*) [4])0x75744c,(char (*) [9])".hxx.cxx");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[5],_const_char_(&)[10],_true>
                  (&local_218,(char (*) [5])"OBJC",(char (*) [10])".objc.h.m");
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<const_char_(&)[7],_const_char_(&)[15],_true>
                  (local_1d8,(char (*) [7])"OBJCXX",(char (*) [15])".objcxx.hxx.mm");
        __l_00._M_len = 4;
        __l_00._M_array = (iterator)local_298;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_350,__l_00,
              (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_2c0,(allocator_type *)&local_318);
        sVar14 = local_2d0;
        lVar13 = -0x100;
        paVar15 = &local_1d8[0].second.field_2;
        do {
          if (paVar15 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar15->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar15->_M_allocated_capacity)[-2],
                            paVar15->_M_allocated_capacity + 1);
          }
          if (&paVar15->_M_allocated_capacity + -4 !=
              (size_type *)(&paVar15->_M_allocated_capacity)[-6]) {
            operator_delete((size_type *)(&paVar15->_M_allocated_capacity)[-6],
                            (&paVar15->_M_allocated_capacity)[-4] + 1);
          }
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar15->_M_allocated_capacity + -8);
          lVar13 = lVar13 + 0x40;
        } while (lVar13 != 0);
        pcVar1 = *(char **)(_Var8._M_node + 2);
        p_Var3 = _Var8._M_node[2]._M_parent;
        if (psVar10->_M_string_length == 0) {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
        }
        else {
          local_288._8_8_ = (psVar10->_M_dataplus)._M_p;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_298._8_8_ = "_";
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_298;
          local_288._M_allocated_capacity = psVar10->_M_string_length;
          cmCatViews_abi_cxx11_(&local_318,views_01);
        }
        _Var4._M_p = local_318._M_dataplus._M_p;
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_350,language);
        local_288._M_allocated_capacity = local_318._M_string_length;
        local_288._8_8_ = _Var4._M_p;
        local_270 = (pmVar11->_M_dataplus)._M_p;
        local_278._M_p = (pointer)pmVar11->_M_string_length;
        views_03._M_len = 3;
        views_03._M_array = (iterator)local_298;
        local_298._0_8_ = p_Var3;
        local_298._8_8_ = pcVar1;
        cmCatViews_abi_cxx11_(&local_2c0,views_03);
      }
      destination = local_2d8;
      std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_2c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      psVar10 = local_320;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_350);
      local_298._8_8_ = *(undefined8 *)(_Var8._M_node + 2);
      local_298._0_8_ = _Var8._M_node[2]._M_parent;
      local_288._M_allocated_capacity = 4;
      local_288._8_8_ = (long)"%s.%s.tmp" + 5;
      views_04._M_len = 2;
      views_04._M_array = (iterator)local_298;
      cmCatViews_abi_cxx11_((string *)local_350,views_04);
      if (local_2a0 == (string *)0x0) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_298,(string *)local_350,false,None);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"/* generated by CMake */\n",0x19);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        cmFileTimes::Copy(&local_2f8,(string *)local_350);
        cmSystemTools::MoveFileIfDifferent((string *)local_350,(string *)destination);
      }
      local_2f8._M_string_length = sVar14;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_350 + 0x10)) {
        operator_delete((void *)local_350._0_8_,local_350._16_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8._M_string_length == 0) {
      return psVar10;
    }
  }
  (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar10,*(long *)(_Var8._M_node + 2),
             (long)&(_Var8._M_node[2]._M_parent)->_M_color + *(long *)(_Var8._M_node + 2));
  return psVar10;
}

Assistant:

std::string cmGeneratorTarget::GetPchSource(const std::string& config,
                                            const std::string& language,
                                            const std::string& arch) const
{
  if (language != "C" && language != "CXX" && language != "OBJC" &&
      language != "OBJCXX") {
    return std::string();
  }
  const auto inserted =
    this->PchSources.insert(std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    if (pchHeader.empty()) {
      return std::string();
    }
    std::string& filename = inserted.first->second;

    const cmGeneratorTarget* generatorTarget = this;
    cmValue pchReuseFrom =
      generatorTarget->GetProperty("PRECOMPILE_HEADERS_REUSE_FROM");
    if (pchReuseFrom) {
      generatorTarget =
        this->GetGlobalGenerator()->FindGeneratorTarget(*pchReuseFrom);
    }

    filename =
      cmStrCat(generatorTarget->LocalGenerator->GetCurrentBinaryDirectory(),
               "/CMakeFiles/", generatorTarget->GetName(), ".dir/cmake_pch");

    // For GCC the source extension will be transformed into .h[xx].gch
    if (!this->Makefile->IsOn("CMAKE_LINK_PCH")) {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".h.c" },
        { "CXX", ".hxx.cxx" },
        { "OBJC", ".objc.h.m" },
        { "OBJCXX", ".objcxx.hxx.mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    } else {
      const std::map<std::string, std::string> languageToExtension = {
        { "C", ".c" }, { "CXX", ".cxx" }, { "OBJC", ".m" }, { "OBJCXX", ".mm" }
      };

      filename = cmStrCat(filename, arch.empty() ? "" : cmStrCat("_", arch),
                          languageToExtension.at(language));
    }

    const std::string filename_tmp = cmStrCat(filename, ".tmp");
    if (!pchReuseFrom) {
      {
        cmGeneratedFileStream file(filename_tmp);
        file << "/* generated by CMake */\n";
      }
      cmFileTimes::Copy(pchHeader, filename_tmp);
      cmSystemTools::MoveFileIfDifferent(filename_tmp, filename);
    }
  }
  return inserted.first->second;
}